

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O1

Error asmjit::v1_14::arm::FormatterInternal::formatOperand
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  uint uVar1;
  undefined3 uVar2;
  Error EVar3;
  Error EVar4;
  uint32_t uVar5;
  RegType RVar6;
  ShiftOp shiftOp;
  FormatFlags FVar7;
  StringFormatFlags SVar8;
  ulong uVar9;
  BaseReg *reg;
  bool bVar10;
  
  uVar1 = (op->_signature)._bits;
  uVar2 = (undefined3)(uVar1 >> 8);
  switch(uVar1 & 7) {
  case 1:
    uVar5 = 0xffffffff;
    if ((short)uVar1 < 0) {
      uVar5 = uVar1 >> 0x10 & 0xf;
    }
    RVar6 = (byte)uVar1 >> 3;
    EVar3 = formatRegister(sb,CONCAT31(uVar2,RVar6),emitter,arch,RVar6,op->_baseId,uVar1 >> 0xc & 7,
                           uVar5);
    break;
  case 2:
    FVar7 = kMachineCode;
    EVar3 = String::_opChar(sb,kAppend,'[');
    if (EVar3 != 0) {
      return EVar3;
    }
    uVar1 = (op->_signature)._bits;
    EVar3 = 0;
    if ((uVar1 & 0xf8) == 0) {
      if ((uVar1 & 0x1f00) == 0) {
        uVar5 = 0;
        if ((uVar1 & 0xf8) == 0) {
          uVar5 = op->_baseId;
        }
        if (uVar5 == 0 && op->_data[1] == 0) goto LAB_0012dbef;
      }
      EVar4 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
LAB_0012db8e:
      if (EVar4 != 0) {
        return EVar4;
      }
    }
    else {
      if ((uVar1 & 0xf8) == 8) {
        EVar4 = Formatter::formatLabel(sb,flags,emitter,op->_baseId);
        goto LAB_0012db8e;
      }
      if ((uVar1 >> 0xd & 1) == 0) {
LAB_0012dbba:
        EVar4 = formatRegister(sb,FVar7,emitter,arch,(byte)(op->_signature)._bits >> 3,op->_baseId,0
                               ,0xffffffff);
        bVar10 = EVar4 == 0;
        if (!bVar10) {
          EVar3 = EVar4;
        }
      }
      else {
        FVar7 = kMachineCode;
        EVar4 = String::_opChar(sb,kAppend,'&');
        if (EVar4 == 0) goto LAB_0012dbba;
        bVar10 = false;
        EVar3 = EVar4;
      }
      if (!bVar10) {
        return EVar3;
      }
    }
LAB_0012dbef:
    if ((((op->_signature)._bits & 0x3000000) == 0x2000000) &&
       (EVar4 = String::_opChar(sb,kAppend,']'), EVar4 != 0)) {
      return EVar4;
    }
    if (((op->_signature)._bits & 0x1f00) != 0) {
      FVar7 = kMachineCode;
      EVar4 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = formatRegister(sb,FVar7,emitter,arch,
                             (RegType)((op->_signature)._bits >> 8) & kMaxValue,op->_data[0],0,
                             0xffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
    }
    uVar5 = 0;
    if (((op->_signature)._bits & 0xf8) == 0) {
      uVar5 = op->_baseId;
    }
    if (uVar5 != 0 || op->_data[1] != 0) {
      EVar4 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      uVar9 = CONCAT44(op->_baseId,op->_data[1]);
      if (((op->_signature)._bits & 0xf8) != 0) {
        uVar9 = (long)(int)op->_data[1];
      }
      uVar5 = 0x10;
      if (((byte)flags >> 3 & 9 < uVar9) == 0) {
        uVar5 = 10;
        SVar8 = kSigned;
LAB_0012dd32:
        bVar10 = false;
        EVar4 = String::_opNumber(sb,kAppend,uVar9,uVar5,0,SVar8);
        if (EVar4 == 0) {
          bVar10 = true;
          EVar4 = EVar3;
        }
      }
      else {
        EVar4 = String::_opString(sb,kAppend,"0x",0xffffffffffffffff);
        if (EVar4 == 0) {
          SVar8 = kNone;
          goto LAB_0012dd32;
        }
        bVar10 = false;
      }
      if (!bVar10) {
        return EVar4;
      }
    }
    if ((((((op->_signature)._bits & 0x7c000) == 0) ||
         ((EVar3 = String::_opChar(sb,kAppend,' '), EVar3 == 0 &&
          (((uVar1 = (op->_signature)._bits, (uVar1 & 0x3000000) != 0 ||
            (EVar3 = formatShiftOp(sb,uVar1 >> 0x14 & (kSXTW|kROR)), EVar3 == 0)) &&
           (EVar3 = String::_opFormat(sb,kAppend," %u",(ulong)((op->_signature)._bits >> 0xe & 0x1f)
                                     ), EVar3 == 0)))))) &&
        ((((op->_signature)._bits & 0x3000000) == 0x2000000 ||
         (EVar3 = String::_opChar(sb,kAppend,']'), EVar3 == 0)))) &&
       ((((op->_signature)._bits & 0x3000000) != 0x1000000 ||
        (EVar3 = String::_opChar(sb,kAppend,'!'), EVar3 == 0)))) {
      EVar3 = 0;
    }
    break;
  case 3:
    RVar6 = (byte)uVar1 >> 3;
    EVar3 = formatRegisterList(sb,CONCAT31(uVar2,RVar6),emitter,arch,RVar6,op->_baseId);
    return EVar3;
  case 4:
    uVar9 = *(ulong *)op->_data;
    shiftOp = uVar1 >> 0x14 & (kSXTW|kROR);
    if ((shiftOp == kLSL) ||
       ((EVar3 = formatShiftOp(sb,shiftOp), EVar3 == 0 &&
        (EVar3 = String::_opChar(sb,kAppend,' '), EVar3 == 0)))) {
      if (((flags & kHexImms) == kNone) || (uVar9 < 10)) {
        uVar5 = 10;
        SVar8 = kSigned;
      }
      else {
        EVar3 = String::_opString(sb,kAppend,"0x",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
        uVar5 = 0x10;
        SVar8 = kNone;
      }
      EVar3 = String::_opNumber(sb,kAppend,uVar9,uVar5,0,SVar8);
      return EVar3;
    }
    break;
  case 5:
    EVar3 = Formatter::formatLabel(sb,flags,emitter,op->_baseId);
    return EVar3;
  default:
    EVar3 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
    return EVar3;
  }
  return EVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatOperand(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

  if (op.isReg()) {
    const BaseReg& reg = op.as<BaseReg>();

    uint32_t elementType = op._signature.getField<BaseVec::kSignatureRegElementTypeMask>();
    uint32_t elementIndex = op.as<BaseVec>().elementIndex();

    if (!op.as<BaseVec>().hasElementIndex())
      elementIndex = 0xFFFFFFFFu;

    return formatRegister(sb, flags, emitter, arch, reg.type(), reg.id(), elementType, elementIndex);
  }

  if (op.isMem()) {
    const Mem& m = op.as<Mem>();
    ASMJIT_PROPAGATE(sb.append('['));

    if (m.hasBase()) {
      if (m.hasBaseLabel()) {
        ASMJIT_PROPAGATE(Formatter::formatLabel(sb, flags, emitter, m.baseId()));
      }
      else {
        FormatFlags modifiedFlags = flags;
        if (m.isRegHome()) {
          ASMJIT_PROPAGATE(sb.append('&'));
          modifiedFlags &= ~FormatFlags::kRegCasts;
        }
        ASMJIT_PROPAGATE(formatRegister(sb, modifiedFlags, emitter, arch, m.baseType(), m.baseId()));
      }
    }
    else {
      // ARM really requires base.
      if (m.hasIndex() || m.hasOffset()) {
        ASMJIT_PROPAGATE(sb.append("<None>"));
      }
    }

    // The post index makes it look like there was another operand, but it's
    // still the part of AsmJit's `arm::Mem` operand so it's consistent with
    // other architectures.
    if (m.isPostIndex())
      ASMJIT_PROPAGATE(sb.append(']'));

    if (m.hasIndex()) {
      ASMJIT_PROPAGATE(sb.append(", "));
      ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, m.indexType(), m.indexId()));
    }

    if (m.hasOffset()) {
      ASMJIT_PROPAGATE(sb.append(", "));

      int64_t off = int64_t(m.offset());
      uint32_t base = 10;

      if (Support::test(flags, FormatFlags::kHexOffsets) && uint64_t(off) > 9)
        base = 16;

      if (base == 10) {
        ASMJIT_PROPAGATE(sb.appendInt(off, base));
      }
      else {
        ASMJIT_PROPAGATE(sb.append("0x"));
        ASMJIT_PROPAGATE(sb.appendUInt(uint64_t(off), base));
      }
    }

    if (m.hasShift()) {
      ASMJIT_PROPAGATE(sb.append(' '));
      if (!m.isPreOrPost())
        ASMJIT_PROPAGATE(formatShiftOp(sb, m.shiftOp()));
      ASMJIT_PROPAGATE(sb.appendFormat(" %u", m.shift()));
    }

    if (!m.isPostIndex())
      ASMJIT_PROPAGATE(sb.append(']'));

    if (m.isPreIndex())
      ASMJIT_PROPAGATE(sb.append('!'));

    return kErrorOk;
  }

  if (op.isImm()) {
    const Imm& i = op.as<Imm>();
    int64_t val = i.value();
    uint32_t predicate = i.predicate();

    if (predicate) {
      ASMJIT_PROPAGATE(formatShiftOp(sb, ShiftOp(predicate)));
      ASMJIT_PROPAGATE(sb.append(' '));
    }

    if (Support::test(flags, FormatFlags::kHexImms) && uint64_t(val) > 9) {
      ASMJIT_PROPAGATE(sb.append("0x"));
      return sb.appendUInt(uint64_t(val), 16);
    }
    else {
      return sb.appendInt(val, 10);
    }
  }

  if (op.isLabel()) {
    return Formatter::formatLabel(sb, flags, emitter, op.id());
  }

  if (op.isRegList()) {
    const BaseRegList& regList = op.as<BaseRegList>();
    return formatRegisterList(sb, flags, emitter, arch, regList.type(), regList.list());
  }

  return sb.append("<None>");
}